

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-info.cpp
# Opt level: O3

void __thiscall
FileInfoWrapper<ASDCP::DCData::MXFReader,_MyDCDataDescriptor>::~FileInfoWrapper
          (FileInfoWrapper<ASDCP::DCData::MXFReader,_MyDCDataDescriptor> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  this->_vptr_FileInfoWrapper = (_func_int **)&PTR__FileInfoWrapper_00110d10;
  pcVar2 = (this->m_WriterInfo).ProductName._M_dataplus._M_p;
  paVar1 = &(this->m_WriterInfo).ProductName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_WriterInfo).CompanyName._M_dataplus._M_p;
  paVar1 = &(this->m_WriterInfo).CompanyName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_WriterInfo).ProductVersion._M_dataplus._M_p;
  paVar1 = &(this->m_WriterInfo).ProductVersion.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  ASDCP::DCData::MXFReader::~MXFReader(&this->m_Reader);
  return;
}

Assistant:

virtual ~FileInfoWrapper() {}